

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O1

int __thiscall
CGraphicsBackend_SDL_OpenGL::Init
          (CGraphicsBackend_SDL_OpenGL *this,char *pName,int *pScreen,int *pWindowWidth,
          int *pWindowHeight,int *pScreenWidth,int *pScreenHeight,int FsaaSamples,int Flags,
          int *pDesktopWidth,int *pDesktopHeight)

{
  long lVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  SDL_Window *pSVar9;
  SDL_GLContext pvVar10;
  ICommandProcessor *pIVar11;
  void *pvVar12;
  CCommand *pCVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  char *fmt;
  ulong uVar17;
  long in_FS_OFFSET;
  CCommandBuffer CmdBuffer;
  SDL_version Linked;
  SDL_Rect ScreenPos;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = SDL_WasInit();
  if ((iVar6 == 0) && (iVar6 = SDL_InitSubSystem(), iVar6 < 0)) {
    uVar8 = SDL_GetError();
    fmt = "unable to init SDL video: %s";
  }
  else {
    iVar6 = SDL_GetNumVideoDisplays();
    this->m_NumScreens = iVar6;
    if (iVar6 < 1) {
      uVar8 = SDL_GetError();
      fmt = "unable to retrieve number of screens: %s";
    }
    else {
      iVar15 = *pScreen;
      iVar14 = iVar6 + -1;
      if (iVar15 < iVar6 + -1) {
        iVar14 = iVar15;
      }
      iVar6 = 0;
      if (-1 < iVar15) {
        iVar6 = iVar14;
      }
      *pScreen = iVar6;
      iVar6 = SDL_GetDisplayBounds(iVar6,&ScreenPos);
      if (iVar6 == 0) {
        iVar6 = (*(this->super_CGraphicsBackend_Threaded).super_IGraphicsBackend.
                  _vptr_IGraphicsBackend[0xd])
                          (this,(ulong)(uint)*pScreen,pDesktopWidth,pDesktopHeight);
        if ((char)iVar6 == '\0') {
          uVar8 = SDL_GetError();
          fmt = "unable to get desktop resolution: %s";
        }
        else {
          if ((*pWindowWidth == 0) || (*pWindowHeight == 0)) {
            *pWindowWidth = *pDesktopWidth;
            *pWindowHeight = *pDesktopHeight;
          }
          if ((Flags & 0x10U) != 0) {
            SDL_SetHint("SDL_VIDEO_X11_XRANDR","1");
          }
          SDL_GL_SetAttribute(5,1);
          SDL_GL_SetAttribute(0xd,FsaaSamples != 0);
          SDL_GL_SetAttribute(0xe,FsaaSamples);
          iVar6 = 0;
          if ((Flags & 1U) == 0) {
            iVar14 = *pDesktopWidth - *pWindowWidth;
            if (iVar14 == 0 || *pDesktopWidth < *pWindowWidth) {
              iVar15 = 0;
            }
            else {
              iVar15 = 0;
              iVar7 = *pDesktopHeight - *pWindowHeight;
              iVar6 = 0;
              if (iVar7 != 0 && *pWindowHeight <= *pDesktopHeight) {
                iVar6 = iVar14 / 2;
                iVar15 = iVar7 / 2;
              }
            }
          }
          else {
            iVar15 = 0;
          }
          pSVar9 = (SDL_Window *)
                   SDL_CreateWindow(pName,iVar6 + ScreenPos.x,iVar15 + ScreenPos.y,*pWindowWidth,
                                    *pWindowHeight,
                                    (Flags & 1U) +
                                    ((Flags & 8U) * 2 + (Flags & 4U) * 8 | (Flags & 0x20U) << 8) + 2
                                   );
          this->m_pWindow = pSVar9;
          if (pSVar9 == (SDL_Window *)0x0) {
            uVar8 = SDL_GetError();
            fmt = "unable to create window: %s";
          }
          else {
            SDL_GetWindowSize(pSVar9,pWindowWidth,pWindowHeight);
            pvVar10 = (SDL_GLContext)SDL_GL_CreateContext(this->m_pWindow);
            this->m_GLContext = pvVar10;
            if (pvVar10 != (SDL_GLContext)0x0) {
              SDL_GL_GetDrawableSize(this->m_pWindow,pScreenWidth,pScreenHeight);
              SDL_GL_SetSwapInterval((uint)Flags >> 1 & 1);
              SDL_GL_MakeCurrent(0,0);
              SDL_GetVersion(&Linked);
              dbg_msg("sdl","SDL version %d.%d.%d (dll = %d.%d.%d)",2,0,0x14,(ulong)Linked.major,
                      (ulong)Linked.minor,(ulong)Linked.patch);
              pIVar11 = (ICommandProcessor *)operator_new(0x20038);
              pIVar11->_vptr_ICommandProcessor = (_func_int **)&PTR__ICommandProcessor_00212a98;
              mem_zero(pIVar11 + 1,0x20000);
              pIVar11[0x4001]._vptr_ICommandProcessor = (_func_int **)0x0;
              this->m_pProcessor = pIVar11;
              (this->super_CGraphicsBackend_Threaded).m_Shutdown = false;
              (this->super_CGraphicsBackend_Threaded).m_pProcessor = pIVar11;
              pvVar12 = thread_init(CGraphicsBackend_Threaded::ThreadFunc,this);
              (this->super_CGraphicsBackend_Threaded).m_pThread = pvVar12;
              semaphore_signal(&(this->super_CGraphicsBackend_Threaded).m_BufferDone.sem);
              CCommandBuffer::CCommandBuffer(&CmdBuffer,0x400,0x200);
              uVar16 = (ulong)((int)CmdBuffer.m_CmdBuffer.m_pData + CmdBuffer.m_CmdBuffer.m_Used & 7
                              );
              uVar17 = (CmdBuffer.m_CmdBuffer.m_Used - uVar16) + 0x28;
              if (CmdBuffer.m_CmdBuffer.m_Size < uVar17) {
                pCVar13 = (CCommand *)0x0;
              }
              else {
                pCVar13 = (CCommand *)
                          (CmdBuffer.m_CmdBuffer.m_pData +
                          (CmdBuffer.m_CmdBuffer.m_Used - uVar16) + 8);
                CmdBuffer.m_CmdBuffer.m_Used = (uint)uVar17;
              }
              if (pCVar13 != (CCommand *)0x0) {
                uVar2 = *(uint *)&this->m_pWindow;
                uVar3 = *(undefined4 *)((long)&this->m_pWindow + 4);
                uVar4 = *(undefined4 *)&this->m_GLContext;
                uVar5 = *(undefined4 *)((long)&this->m_GLContext + 4);
                pCVar13->m_Cmd = 20000;
                pCVar13->m_pNext = (CCommand *)0x0;
                pCVar13[1].m_Cmd = uVar2;
                *(undefined4 *)&pCVar13[1].field_0x4 = uVar3;
                *(undefined4 *)&pCVar13[1].m_pNext = uVar4;
                *(undefined4 *)((long)&pCVar13[1].m_pNext + 4) = uVar5;
                if (CmdBuffer.m_pCmdBufferTail != (CCommand *)0x0) {
                  (CmdBuffer.m_pCmdBufferTail)->m_pNext = pCVar13;
                }
                CmdBuffer.m_pCmdBufferTail = pCVar13;
                if (CmdBuffer.m_pCmdBufferHead == (CCommand *)0x0) {
                  CmdBuffer.m_pCmdBufferHead = pCVar13;
                }
              }
              uVar16 = (ulong)((int)CmdBuffer.m_CmdBuffer.m_pData + CmdBuffer.m_CmdBuffer.m_Used & 7
                              );
              uVar17 = (CmdBuffer.m_CmdBuffer.m_Used - uVar16) + 0x28;
              if (CmdBuffer.m_CmdBuffer.m_Size < uVar17) {
                pCVar13 = (CCommand *)0x0;
              }
              else {
                pCVar13 = (CCommand *)
                          (CmdBuffer.m_CmdBuffer.m_pData +
                          (CmdBuffer.m_CmdBuffer.m_Used - uVar16) + 8);
                CmdBuffer.m_CmdBuffer.m_Used = (uint)uVar17;
              }
              if (pCVar13 != (CCommand *)0x0) {
                pCVar13->m_Cmd = 10000;
                pCVar13->m_pNext = (CCommand *)0x0;
                *(int **)(pCVar13 + 1) = &this->m_TextureMemoryUsage;
                pCVar13[1].m_pNext = (CCommand *)&this->m_TextureArraySize;
                if (CmdBuffer.m_pCmdBufferTail != (CCommand *)0x0) {
                  (CmdBuffer.m_pCmdBufferTail)->m_pNext = pCVar13;
                }
                CmdBuffer.m_pCmdBufferTail = pCVar13;
                if (CmdBuffer.m_pCmdBufferHead == (CCommand *)0x0) {
                  CmdBuffer.m_pCmdBufferHead = pCVar13;
                }
              }
              (*(this->super_CGraphicsBackend_Threaded).super_IGraphicsBackend.
                _vptr_IGraphicsBackend[0x11])(this,&CmdBuffer);
              (*(this->super_CGraphicsBackend_Threaded).super_IGraphicsBackend.
                _vptr_IGraphicsBackend[0x13])(this);
              if (CmdBuffer.m_DataBuffer.m_pData != (uchar *)0x0) {
                operator_delete__(CmdBuffer.m_DataBuffer.m_pData);
              }
              CmdBuffer.m_DataBuffer.m_pData = (uchar *)0x0;
              CmdBuffer.m_DataBuffer.m_Size = 0;
              CmdBuffer.m_DataBuffer.m_Used = 0;
              if (CmdBuffer.m_CmdBuffer.m_pData != (uchar *)0x0) {
                operator_delete__(CmdBuffer.m_CmdBuffer.m_pData);
              }
              iVar6 = 0;
              goto LAB_0011db3e;
            }
            uVar8 = SDL_GetError();
            fmt = "unable to create OpenGL context: %s";
          }
        }
      }
      else {
        uVar8 = SDL_GetError();
        fmt = "unable to retrieve screen information: %s";
      }
    }
  }
  dbg_msg("gfx",fmt,uVar8);
  iVar6 = -1;
LAB_0011db3e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int CGraphicsBackend_SDL_OpenGL::Init(const char *pName, int *pScreen, int *pWindowWidth, int *pWindowHeight, int* pScreenWidth, int* pScreenHeight, int FsaaSamples, int Flags, int *pDesktopWidth, int *pDesktopHeight)
{
	if(!SDL_WasInit(SDL_INIT_VIDEO))
	{
		if(SDL_InitSubSystem(SDL_INIT_VIDEO) < 0)
		{
			dbg_msg("gfx", "unable to init SDL video: %s", SDL_GetError());
			return -1;
		}
	}

	// set screen
	SDL_Rect ScreenPos;
	m_NumScreens = SDL_GetNumVideoDisplays();
	if(m_NumScreens > 0)
	{
		*pScreen = clamp(*pScreen, 0, m_NumScreens-1);
		if(SDL_GetDisplayBounds(*pScreen, &ScreenPos) != 0)
		{
			dbg_msg("gfx", "unable to retrieve screen information: %s", SDL_GetError());
			return -1;
		}
	}
	else
	{
		dbg_msg("gfx", "unable to retrieve number of screens: %s", SDL_GetError());
		return -1;
	}

	// store desktop resolution for settings reset button
	if(!GetDesktopResolution(*pScreen, pDesktopWidth, pDesktopHeight))
	{
		dbg_msg("gfx", "unable to get desktop resolution: %s", SDL_GetError());
		return -1;
	}

	// use desktop resolution as default resolution
	if (*pWindowWidth == 0 || *pWindowHeight == 0)
	{
		*pWindowWidth = *pDesktopWidth;
		*pWindowHeight = *pDesktopHeight;
	}

	// set flags
	int SdlFlags = SDL_WINDOW_OPENGL;
	if(Flags&IGraphicsBackend::INITFLAG_HIGHDPI)
		SdlFlags |= SDL_WINDOW_ALLOW_HIGHDPI;
	if(Flags&IGraphicsBackend::INITFLAG_RESIZABLE)
		SdlFlags |= SDL_WINDOW_RESIZABLE;
	if(Flags&IGraphicsBackend::INITFLAG_BORDERLESS)
		SdlFlags |= SDL_WINDOW_BORDERLESS;
	if(Flags&IGraphicsBackend::INITFLAG_FULLSCREEN)
#if defined(CONF_PLATFORM_MACOSX)	// Todo SDL: remove this when fixed (game freezes when losing focus in fullscreen)
	{
		SdlFlags |= SDL_WINDOW_FULLSCREEN_DESKTOP;	// always use "fake" fullscreen
		*pWindowWidth = *pDesktopWidth;
		*pWindowHeight = *pDesktopHeight;
	}
#else
		SdlFlags |= SDL_WINDOW_FULLSCREEN;
#endif

	if(Flags&IGraphicsBackend::INITFLAG_X11XRANDR)
		SDL_SetHint(SDL_HINT_VIDEO_X11_XRANDR, "1");

	// set gl attributes
	SDL_GL_SetAttribute(SDL_GL_DOUBLEBUFFER, 1);
	if(FsaaSamples)
	{
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 1);
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, FsaaSamples);
	}
	else
	{
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 0);
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, 0);
	}

	// calculate centered position in windowed mode
	int OffsetX = 0;
	int OffsetY = 0;
	if(!(Flags&IGraphicsBackend::INITFLAG_FULLSCREEN) && *pDesktopWidth > *pWindowWidth && *pDesktopHeight > *pWindowHeight)
	{
		OffsetX = (*pDesktopWidth - *pWindowWidth) / 2;
		OffsetY = (*pDesktopHeight - *pWindowHeight) / 2;
	}

	// create window
	m_pWindow = SDL_CreateWindow(pName, ScreenPos.x+OffsetX, ScreenPos.y+OffsetY, *pWindowWidth, *pWindowHeight, SdlFlags);
	if(m_pWindow == NULL)
	{
		dbg_msg("gfx", "unable to create window: %s", SDL_GetError());
		return -1;
	}

	SDL_GetWindowSize(m_pWindow, pWindowWidth, pWindowHeight);

	// create gl context
	m_GLContext = SDL_GL_CreateContext(m_pWindow);
	if(m_GLContext == NULL)
	{
		dbg_msg("gfx", "unable to create OpenGL context: %s", SDL_GetError());
		return -1;
	}

	SDL_GL_GetDrawableSize(m_pWindow, pScreenWidth, pScreenHeight); // drawable size may differ in high dpi mode

	#if defined(CONF_FAMILY_WINDOWS)
		glTexImage3DInternal = (PFNGLTEXIMAGE3DPROC) wglGetProcAddress("glTexImage3D");
		if(glTexImage3DInternal == 0)
		{
			dbg_msg("gfx", "glTexImage3D not supported");
			return -1;
		}
	#endif

	SDL_GL_SetSwapInterval(Flags&IGraphicsBackend::INITFLAG_VSYNC ? 1 : 0);

	SDL_GL_MakeCurrent(NULL, NULL);

	// print sdl version
	SDL_version Compiled;
	SDL_version Linked;

	SDL_VERSION(&Compiled);
	SDL_GetVersion(&Linked);
	dbg_msg("sdl", "SDL version %d.%d.%d (dll = %d.%d.%d)", Compiled.major, Compiled.minor, Compiled.patch, Linked.major, Linked.minor, Linked.patch);

	// start the command processor
	m_pProcessor = new CCommandProcessor_SDL_OpenGL;
	StartProcessor(m_pProcessor);

	// issue init commands for OpenGL and SDL
	CCommandBuffer CmdBuffer(1024, 512);
	CCommandProcessorFragment_SDL::CInitCommand CmdSDL;
	CmdSDL.m_pWindow = m_pWindow;
	CmdSDL.m_GLContext = m_GLContext;
	CmdBuffer.AddCommand(CmdSDL);
	CCommandProcessorFragment_OpenGL::CInitCommand CmdOpenGL;
	CmdOpenGL.m_pTextureMemoryUsage = &m_TextureMemoryUsage;
	CmdOpenGL.m_pTextureArraySize = &m_TextureArraySize;
	CmdBuffer.AddCommand(CmdOpenGL);
	RunBuffer(&CmdBuffer);
	WaitForIdle();

	return 0;
}